

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringTest.cpp
# Opt level: O1

void __thiscall StringTest::Test11(StringTest *this)

{
  int iVar1;
  char cVar2;
  string t1;
  string t2;
  long *local_58 [2];
  long local_48 [2];
  long *local_38 [2];
  long local_28 [2];
  
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"This is y a sentence with vowels.","");
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"aeiou","");
  iVar1 = std::__cxx11::string::find_last_of((char *)local_58,(ulong)local_38[0],0xffffffffffffffff)
  ;
  if (iVar1 != 0x1d) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x2a4,"Failed to find first vowel");
  }
  iVar1 = std::__cxx11::string::find_last_of((char *)local_58,(ulong)local_38[0],0x1d);
  if (iVar1 != 0x1d) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x2ab,"Failed to find first vowel");
  }
  iVar1 = std::__cxx11::string::find_last_of((char *)local_58,(ulong)local_38[0],0x1c);
  if (iVar1 != 0x1b) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x2b2,"Failed to find second vowel");
  }
  iVar1 = std::__cxx11::string::find_last_of((char *)local_58,0x10799f,0x1a);
  if (iVar1 != 0x16) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x2b9,"Failed to find second vowel");
  }
  iVar1 = std::__cxx11::string::find_last_of((char *)local_58,0x1079dc,9);
  if (iVar1 != 5) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x2c0,"Failed to find third vowel");
  }
  cVar2 = (char)local_58;
  iVar1 = std::__cxx11::string::rfind(cVar2,0x79);
  if (iVar1 != 8) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x2c7,"Failed to find \'y\'");
  }
  iVar1 = std::__cxx11::string::rfind(cVar2,0x73);
  if (iVar1 != 0x1f) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x2ce,"Failed to find \'s\'");
  }
  iVar1 = std::__cxx11::string::rfind(cVar2,0x73);
  if (iVar1 != 6) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x2d5,"Failed to find \'s\'");
  }
  TestCase::TestPassed(&this->super_TestCase);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  return;
}

Assistant:

void Test11()
	{
		// find_first_of
		string t1 = "This is y a sentence with vowels.";
		string t2 = "aeiou";
		
		unsigned i = t1.find_last_of( t2 );
		
		LOG_NOTICE( "i is %d", i );
		
		if ( i != 29 )
			TestFailed( "Failed to find first vowel" );

		i = t1.find_last_of( t2, 29 );

		LOG_NOTICE( "i is %d", i );

		if ( i != 29 )
			TestFailed( "Failed to find first vowel" );

		i = t1.find_last_of( t2, 28 );

		LOG_NOTICE( "i is %d", i );

		if ( i != 27 )
			TestFailed( "Failed to find second vowel" );

		i = t1.find_last_of( "aeiou", 26 );

		LOG_NOTICE( "i is %d", i );

		if ( i != 22 )
			TestFailed( "Failed to find second vowel" );

		i = t1.find_last_of( "aeiouy", 9, 5 );

		LOG_NOTICE( "i is %d", i );

		if ( i != 5 )
			TestFailed( "Failed to find third vowel" );

		i = t1.find_last_of( 'y' );

		LOG_NOTICE( "i is %d", i );

		if ( i != 8 )
			TestFailed( "Failed to find \'y\'" );

		i = t1.find_last_of( 's' );

		LOG_NOTICE( "i is %d", i );

		if ( i != 31 )
			TestFailed( "Failed to find \'s\'" );

		i = t1.find_last_of( 's', 8 );

		LOG_NOTICE( "i is %d", i );

		if ( i != 6 )
			TestFailed( "Failed to find \'s\'" );
		
		TestPassed();
	}